

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

Size __thiscall CS248::Face::degree(Face *this)

{
  _List_node_base *p_Var1;
  Size SVar2;
  _List_node_base *p_Var3;
  
  p_Var1 = (this->_halfedge)._M_node;
  SVar2 = 0;
  p_Var3 = p_Var1;
  do {
    SVar2 = SVar2 + 1;
    p_Var3 = p_Var3[2]._M_next;
  } while (p_Var1 != p_Var3);
  return SVar2;
}

Assistant:

Size degree() const {
    Size d = 0;  // degree

    // walk around the face
    HalfedgeIter h = _halfedge;
    do {
      d++;  // increment the degree
      h = h->next();
    } while (h != _halfedge);  // done walking around the face

    return d;
  }